

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NetworkBroker_impl.hpp
# Opt level: O0

string * __thiscall
helics::NetworkBroker<helics::tcp::TcpCommsSS,(gmlc::networking::InterfaceTypes)0,11>::
generateLocalAddressString_abi_cxx11_
          (NetworkBroker<helics::tcp::TcpCommsSS,_(gmlc::networking::InterfaceTypes)0,_11> *this)

{
  undefined1 uVar1;
  bool bVar2;
  const_reference pvVar3;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RSI;
  CommsInterface *in_RDI;
  NetworkCommsInterface *in_stack_00000028;
  lock_guard<std::mutex> lock;
  string *add;
  mutex_type *in_stack_ffffffffffffff28;
  CommsInterface *__n;
  undefined7 in_stack_ffffffffffffff48;
  int in_stack_ffffffffffffff64;
  string *in_stack_ffffffffffffff68;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff80;
  
  __n = in_RDI;
  std::__cxx11::string::string(in_RSI);
  CLI::std::unique_ptr<helics::tcp::TcpCommsSS,_std::default_delete<helics::tcp::TcpCommsSS>_>::
  operator->((unique_ptr<helics::tcp::TcpCommsSS,_std::default_delete<helics::tcp::TcpCommsSS>_> *)
             0x49643f);
  uVar1 = CommsInterface::isConnected(in_RDI);
  if ((bool)uVar1) {
    CLI::std::unique_ptr<helics::tcp::TcpCommsSS,_std::default_delete<helics::tcp::TcpCommsSS>_>::
    operator->((unique_ptr<helics::tcp::TcpCommsSS,_std::default_delete<helics::tcp::TcpCommsSS>_> *
               )0x496468);
    NetworkCommsInterface::getAddress_abi_cxx11_(in_stack_00000028);
    CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
              (in_stack_ffffffffffffff80,in_stack_ffffffffffffff78);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)in_RDI);
  }
  else {
    CLI::std::lock_guard<std::mutex>::lock_guard
              ((lock_guard<std::mutex> *)in_RDI,in_stack_ffffffffffffff28);
    bVar2 = CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
            empty((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x4964e7);
    if ((bVar2) ||
       (pvVar3 = CLI::std::__cxx11::
                 basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::back
                           ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            in_RDI), *pvVar3 != '*')) {
      gmlc::networking::makePortAddress(in_stack_ffffffffffffff68,in_stack_ffffffffffffff64);
      CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
      operator=(in_stack_ffffffffffffff80,in_stack_ffffffffffffff78);
      std::__cxx11::string::~string
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)in_RDI);
    }
    else {
      CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::size
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 &in_RSI[0x77].field_2);
      CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::substr
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT17(uVar1,in_stack_ffffffffffffff48),(size_type)in_RSI,(size_type)__n);
      gmlc::networking::makePortAddress(in_stack_ffffffffffffff68,in_stack_ffffffffffffff64);
      CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
      operator=(in_stack_ffffffffffffff80,in_stack_ffffffffffffff78);
      std::__cxx11::string::~string
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)in_RDI);
      std::__cxx11::string::~string
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)in_RDI);
    }
    CLI::std::lock_guard<std::mutex>::~lock_guard((lock_guard<std::mutex> *)0x4965fd);
  }
  return (string *)__n;
}

Assistant:

std::string NetworkBroker<COMMS, baseline, tcode>::generateLocalAddressString() const
{
    using InterfaceTypes = gmlc::networking::InterfaceTypes;
    std::string add;
    if (CommsBroker<COMMS, CoreBroker>::comms->isConnected()) {
        add = CommsBroker<COMMS, CoreBroker>::comms->getAddress();
    } else {
        std::lock_guard<std::mutex> lock(dataMutex);
        switch (baseline) {
            case InterfaceTypes::TCP:
            case InterfaceTypes::IP:
            case InterfaceTypes::UDP:
                if (!netInfo.localInterface.empty() && (netInfo.localInterface.back() == '*')) {
                    add = gmlc::networking::makePortAddress(
                        netInfo.localInterface.substr(0, netInfo.localInterface.size() - 1),
                        netInfo.portNumber);
                } else {
                    add = gmlc::networking::makePortAddress(netInfo.localInterface,
                                                            netInfo.portNumber);
                }
                break;
            case InterfaceTypes::INPROC:
            case InterfaceTypes::IPC:
            default:
                if (!netInfo.localInterface.empty()) {
                    add = netInfo.localInterface;
                } else {
                    add = CoreBroker::getIdentifier();
                }
                break;
        }
    }
    return add;
}